

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_count_edges.h
# Opt level: O3

int s2shapeutil::CountEdgesUpTo<S2ShapeIndex>(S2ShapeIndex *index,int max_edges)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  S2ShapeIndex *__range2;
  long *plVar3;
  
  uVar1 = (*index->_vptr_S2ShapeIndex[2])();
  if (uVar1 == 0) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    uVar6 = 0;
    do {
      iVar2 = (*index->_vptr_S2ShapeIndex[3])(index,uVar6);
      plVar3 = (long *)CONCAT44(extraout_var,iVar2);
      if (plVar3 != (long *)0x0) {
        iVar2 = (**(code **)(*plVar3 + 0x10))(plVar3);
        iVar4 = iVar4 + iVar2;
        if (max_edges <= iVar4) {
          return iVar4;
        }
      }
      uVar5 = (int)uVar6 + 1;
      uVar6 = (ulong)uVar5;
    } while (uVar1 != uVar5);
  }
  return iVar4;
}

Assistant:

int CountEdgesUpTo(const S2ShapeIndexType& index, int max_edges) {
  int num_edges = 0;
  for (S2Shape* shape : index) {
    if (shape == nullptr) continue;
    num_edges += shape->num_edges();
    if (num_edges >= max_edges) break;
  }
  return num_edges;
}